

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

CharPtr __thiscall
fmt::BasicWriter<char>::write_str<char>(BasicWriter<char> *this,char *s,size_t size,AlignSpec *spec)

{
  byte bVar1;
  CharPtr __s;
  size_t __len_1;
  ulong __n;
  ulong uVar2;
  size_t __len_3;
  size_t __n_00;
  size_t __len_2;
  ulong uVar3;
  
  uVar2 = (ulong)(spec->super_WidthSpec).width_;
  if (uVar2 <= size) {
    __s = grow_buffer(this,size);
    goto LAB_0011c766;
  }
  __s = grow_buffer(this,uVar2);
  bVar1 = (byte)(spec->super_WidthSpec).fill_;
  uVar2 = (ulong)(spec->super_WidthSpec).width_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar3 = uVar2 - size;
    __n = uVar3 >> 1;
    if (1 < uVar3) {
      memset(__s,(uint)bVar1,__n);
    }
    __s = __s + __n;
    if (uVar2 == size) goto LAB_0011c766;
    __n_00 = uVar3 - __n;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      if (uVar2 - size != 0) {
        memset(__s,(uint)bVar1,uVar2 - size);
        uVar2 = (ulong)(spec->super_WidthSpec).width_;
      }
      __s = __s + (uVar2 - size);
      goto LAB_0011c766;
    }
    __n_00 = uVar2 - size;
    if (__n_00 == 0) goto LAB_0011c766;
  }
  memset(__s + size,(uint)bVar1,__n_00);
LAB_0011c766:
  if (size != 0) {
    memmove(__s,s,size);
  }
  return __s;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::write_str(
      const StrChar *s, std::size_t size, const AlignSpec &spec) {
  CharPtr out = CharPtr();
  if (spec.width() > size) {
    out = grow_buffer(spec.width());
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.align() == ALIGN_RIGHT) {
      std::uninitialized_fill_n(out, spec.width() - size, fill);
      out += spec.width() - size;
    } else if (spec.align() == ALIGN_CENTER) {
      out = fill_padding(out, spec.width(), size, fill);
    } else {
      std::uninitialized_fill_n(out + size, spec.width() - size, fill);
    }
  } else {
    out = grow_buffer(size);
  }
  std::uninitialized_copy(s, s + size, out);
  return out;
}